

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceDirectional::IfcLightSourceDirectional
          (IfcLightSourceDirectional *this)

{
  IfcLightSourceDirectional *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x98,"IfcLightSourceDirectional");
  IfcLightSource::IfcLightSource(&this->super_IfcLightSource,&PTR_construction_vtable_24__00fa34d8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceDirectional,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceDirectional,_1UL> *)
             &(this->super_IfcLightSource).field_0x80,&PTR_construction_vtable_24__00fa3550);
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfa3420;
  *(undefined8 *)&this->field_0x98 = 0xfa34c0;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfa3448;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfa3470;
  *(undefined8 *)&(this->super_IfcLightSource).field_0x80 = 0xfa3498;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *)&(this->super_IfcLightSource).field_0x90
             ,(LazyObject *)0x0);
  return;
}

Assistant:

IfcLightSourceDirectional() : Object("IfcLightSourceDirectional") {}